

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_sparse.c
# Opt level: O1

void test_write_format_tar_sparse(void)

{
  undefined1 auVar1 [16];
  archive *_a;
  int iVar2;
  mode_t mVar3;
  wchar_t wVar4;
  void *pvVar5;
  archive *paVar6;
  time_t tVar7;
  long lVar8;
  char *pcVar9;
  ssize_t sVar10;
  int64_t iVar11;
  size_t s;
  ulong uVar12;
  bool bVar13;
  archive_entry *ae;
  size_t used;
  int64_t length;
  int64_t offset;
  char buff3 [1024];
  archive_entry *local_470;
  archive *local_468;
  archive *local_460;
  size_t local_458;
  longlong local_450;
  longlong local_448;
  ulong local_440;
  undefined1 local_438 [1032];
  
  pvVar5 = malloc(0x13000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L',',(uint)(pvVar5 != (void *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  uVar12 = 1;
  local_468 = (archive *)pvVar5;
  do {
    paVar6 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'0',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_pax(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'2',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar6);
    iVar2 = archive_write_add_filter_none(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar6);
    iVar2 = archive_write_set_bytes_per_block(paVar6,(int)uVar12);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'6',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar6);
    iVar2 = archive_write_set_bytes_in_last_block(paVar6,(int)uVar12);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'8',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar6);
    iVar2 = archive_write_get_bytes_in_last_block(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L':',uVar12,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    iVar2 = archive_write_open_memory(paVar6,buff,1000000,&local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'<',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar6);
    iVar2 = archive_write_get_bytes_in_last_block(paVar6);
    local_440 = uVar12;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'>',uVar12,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    local_470 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'C',(uint)(local_470 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(local_470,1,10);
    tVar7 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'E',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'F',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    archive_entry_copy_pathname(local_470,"file");
    pcVar9 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'H',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode(local_470,0x81ed);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'J',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size(local_470,0x81000);
    archive_entry_sparse_add_entry(local_470,0x10000,0x1000);
    archive_entry_sparse_add_entry(local_470,0x80000,0x1000);
    iVar2 = archive_write_header(paVar6,local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar6);
    archive_entry_free(local_470);
    memset(local_468,0x61,0x13000);
    lVar8 = 0;
    do {
      s = 0x81000 - lVar8;
      if (0xfffffffffff7effe < lVar8 - 0x6e001U) {
        s = 0x13000;
      }
      sVar10 = archive_write_data(paVar6,local_468,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'W',s,"ws",sVar10,"archive_write_data(a, buff2, ws)",(void *)0x0);
      lVar8 = lVar8 + s;
    } while (lVar8 < 0x81000);
    iVar2 = archive_write_close(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar6);
    iVar2 = archive_write_free(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    uVar12 = local_440;
    failure("blocksize=%d",local_440);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'b',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2bff)) / auVar1,0) + 1) *
                              uVar12,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                        (void *)0x0);
    paVar6 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'g',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_format_all(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'i',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar6
                       );
    iVar2 = archive_read_support_filter_all(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'k',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar6
                       );
    iVar2 = archive_read_open_memory(paVar6,buff,local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'm',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                        paVar6);
    iVar2 = archive_read_next_header(paVar6,&local_470);
    local_460 = paVar6;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'p',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
    tVar7 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'r',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L's',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L't',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'u',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'v',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_filetype(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'w',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'x',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar11 = archive_entry_size(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'y',0x81000,"0x81000",iVar11,"archive_entry_size(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_reset(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'{',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'}',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                        (void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'~',0x10000,"0x10000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x7f',0x1000,"0x1000",local_450,"length",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x81',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)"
                        ,(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x82',0x80000,"0x80000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x83',0x1000,"0x1000",local_450,"length",(void *)0x0);
    memset(local_438,0,0x400);
    uVar12 = 0;
    paVar6 = local_468;
    do {
      sVar10 = archive_read_data(local_460,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x87',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar12,uVar12 + 0x400);
      paVar6 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x8a',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar13 = uVar12 < 0xfc00;
      uVar12 = uVar12 + 0x400;
    } while (bVar13);
    memset(local_438,0x61,0x400);
    uVar12 = 0x10000;
    do {
      sVar10 = archive_read_data(local_460,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x8e',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar12,uVar12 + 0x400);
      paVar6 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x91',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar13 = uVar12 < 0x10c00;
      uVar12 = uVar12 + 0x400;
    } while (bVar13);
    memset(local_438,0,0x400);
    _a = local_460;
    uVar12 = 0x11000;
    do {
      sVar10 = archive_read_data(_a,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x95',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar12,uVar12 + 0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x98',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar13 = uVar12 < 0x7fc00;
      uVar12 = uVar12 + 0x400;
    } while (bVar13);
    memset(local_438,0x61,0x400);
    uVar12 = 0x80000;
    do {
      sVar10 = archive_read_data(_a,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9c',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar12,uVar12 + 0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9f',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar13 = uVar12 < 0x80c00;
      uVar12 = uVar12 + 0x400;
    } while (bVar13);
    iVar2 = archive_read_next_header(_a,&local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¤',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",_a);
    iVar2 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¥',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",_a);
    iVar2 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¦',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    uVar12 = local_440 * 2 + 3;
  } while (local_440 < 49999);
  free(paVar6);
  pvVar5 = malloc(0x11000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'»',(uint)(pvVar5 != (void *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'½',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_pax(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'¿',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar6);
  iVar2 = archive_write_add_filter_none(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Á',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar6);
  iVar2 = archive_write_set_bytes_per_block(paVar6,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ã',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar6);
  iVar2 = archive_write_set_bytes_in_last_block(paVar6,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar6);
  iVar2 = archive_write_get_bytes_in_last_block(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ç',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  iVar2 = archive_write_open_memory(paVar6,buff,1000000,&local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar6);
  iVar2 = archive_write_get_bytes_in_last_block(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ë',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  local_470 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'Ð',(uint)(local_470 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_470,1,10);
  tVar7 = archive_entry_mtime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ò',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ó',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_470,"file");
  pcVar9 = archive_entry_pathname(local_470);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'Õ',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_470,0x81ed);
  mVar3 = archive_entry_mode(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'×',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(local_470,0x81000);
  archive_entry_sparse_add_entry(local_470,0x10000,0x1000);
  archive_entry_sparse_add_entry(local_470,0x80000,0x1000);
  iVar2 = archive_write_header(paVar6,local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ü',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar6);
  archive_entry_free(local_470);
  memset(pvVar5,0x61,0x11000);
  sVar10 = archive_write_data(paVar6,pvVar5,0x11000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'à',0x11000,"buff2_size",sVar10,"archive_write_data(a, buff2, buff2_size)",
                      (void *)0x0);
  iVar2 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar6);
  iVar2 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  failure("blocksize=%d",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'é',0x5000,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                      (void *)0x0);
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'î',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar6)
  ;
  iVar2 = archive_read_support_filter_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar6)
  ;
  iVar2 = archive_read_open_memory(paVar6,buff,local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ñ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar6);
  iVar2 = archive_read_next_header(paVar6,&local_470);
  local_468 = paVar6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ó',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
  tVar7 = archive_entry_mtime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'õ',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ö',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar7 = archive_entry_atime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'÷',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  tVar7 = archive_entry_ctime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ø',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar9 = archive_entry_pathname(local_470);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'ù',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ú',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar3 = archive_entry_mode(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'û',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar11 = archive_entry_size(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ü',0x81000,"0x81000",iVar11,"archive_entry_size(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_reset(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'þ',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ÿ',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ā',0x10000,"0x10000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ā',0x1000,"0x1000",local_450,"length",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ă',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ă',0x80000,"0x80000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ą',0x1000,"0x1000",local_450,"length",(void *)0x0);
  memset(local_438,0,0x400);
  uVar12 = 0;
  do {
    sVar10 = archive_read_data(local_468,pvVar5,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ĉ',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar12,uVar12 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ċ',pvVar5,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar13 = uVar12 < 0xfc00;
    uVar12 = uVar12 + 0x400;
  } while (bVar13);
  memset(local_438,0x61,0x400);
  uVar12 = 0x10000;
  do {
    sVar10 = archive_read_data(local_468,pvVar5,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ď',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar12,uVar12 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ē',pvVar5,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar13 = uVar12 < 0x10c00;
    uVar12 = uVar12 + 0x400;
  } while (bVar13);
  memset(local_438,0,0x400);
  uVar12 = 0x11000;
  do {
    sVar10 = archive_read_data(local_468,pvVar5,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ė',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar12,uVar12 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ę',pvVar5,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar13 = uVar12 < 0x7fc00;
    uVar12 = uVar12 + 0x400;
  } while (bVar13);
  memset(local_438,0,0x400);
  uVar12 = 0x80000;
  local_460 = (archive *)pvVar5;
  do {
    sVar10 = archive_read_data(local_468,pvVar5,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ĝ',0x400,"1024",sVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar12,uVar12 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ġ',pvVar5,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    paVar6 = local_468;
    bVar13 = uVar12 < 0x80c00;
    uVar12 = uVar12 + 0x400;
  } while (bVar13);
  iVar2 = archive_read_next_header(local_468,&local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ĥ',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
  iVar2 = archive_read_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ħ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar6);
  iVar2 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ħ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  free(local_460);
  return;
}

Assistant:

static void
test_1(void)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t blocksize;
	int64_t offset, length;
	char *buff2;
	size_t buff2_size = 0x13000;
	char buff3[1024];
	long i;

	assert((buff2 = malloc(buff2_size)) != NULL);
	/* Repeat the following for a variety of odd blocksizes. */
	for (blocksize = 1; blocksize < 100000; blocksize += blocksize + 3) {
		/* Create a new archive in memory. */
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_pax(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_none(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, (int)blocksize));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));

		/*
		 * Write a file to it.
		 */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, 1, 10);
		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		archive_entry_copy_pathname(ae, "file");
		assertEqualString("file", archive_entry_pathname(ae));
		archive_entry_set_mode(ae, S_IFREG | 0755);
		assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
		archive_entry_set_size(ae, 0x81000);
		archive_entry_sparse_add_entry(ae, 0x10000, 0x1000);
		archive_entry_sparse_add_entry(ae, 0x80000, 0x1000);

		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);
		memset(buff2, 'a', buff2_size);
		for (i = 0; i < 0x81000;) {
			size_t ws = buff2_size;
			if (i + ws > 0x81000)
				ws = 0x81000 - i;
			assertEqualInt(ws,
				archive_write_data(a, buff2, ws));
			i += (long)ws;
		}

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* This calculation gives "the smallest multiple of
		 * the block size that is at least 11264 bytes". */
		failure("blocksize=%d", blocksize);
		assertEqualInt(((11264 - 1)/blocksize+1)*blocksize, used);

		/*
		 * Now, read the data back.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used));

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));

		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		assertEqualInt(0, archive_entry_atime(ae));
		assertEqualInt(0, archive_entry_ctime(ae));
		assertEqualString("file", archive_entry_pathname(ae));
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
		assertEqualInt(0x81000, archive_entry_size(ae));
		/* Verify sparse information. */
		assertEqualInt(2, archive_entry_sparse_reset(ae));
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x10000, offset);
		assertEqualInt(0x1000, length);
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x80000, offset);
		assertEqualInt(0x1000, length);
		/* Verify file contents. */
		memset(buff3, 0, sizeof(buff3));
		for (i = 0; i < 0x10000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x10000; i < 0x11000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 0, sizeof(buff3));
		for (i = 0x11000; i < 0x80000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x80000; i < 0x81000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff2);
}